

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O2

bool cmSubdirCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  bool bVar1;
  bool excludeFromAll;
  bool bVar2;
  string *psVar3;
  pointer __lhs;
  string binPath;
  string srcPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string *local_a0;
  pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_98 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == local_98) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"called with incorrect number of arguments",
               (allocator<char> *)&local_c0);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_90);
    bVar2 = false;
  }
  else {
    this = status->Makefile;
    local_a0 = (string *)&status->Error;
    bVar2 = true;
    excludeFromAll = false;
    for (; __lhs != local_98; __lhs = __lhs + 1) {
      bVar1 = std::operator==(__lhs,"EXCLUDE_FROM_ALL");
      if (bVar1) {
        excludeFromAll = true;
      }
      else {
        bVar1 = std::operator==(__lhs,"PREORDER");
        if (!bVar1) {
          psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          std::operator+(&local_c0,psVar3,"/");
          std::operator+(&local_90,&local_c0,__lhs);
          std::__cxx11::string::~string((string *)&local_c0);
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_90);
          if (bVar1) {
            psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            std::operator+(&local_70,psVar3,"/");
            std::operator+(&local_c0,&local_70,__lhs);
            std::__cxx11::string::~string((string *)&local_70);
            cmMakefile::AddSubDirectory(this,&local_90,&local_c0,excludeFromAll,false,false);
LAB_00397813:
            std::__cxx11::string::~string((string *)&local_c0);
          }
          else {
            bVar1 = cmsys::SystemTools::FileIsDirectory(__lhs);
            if (bVar1) {
              psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
              std::operator+(&local_70,psVar3,"/");
              cmsys::SystemTools::GetFilenameName(&local_50,__lhs);
              std::operator+(&local_c0,&local_70,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              cmMakefile::AddSubDirectory(this,__lhs,&local_c0,excludeFromAll,false,false);
              goto LAB_00397813;
            }
            cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[17]>
                      (&local_c0,(char (*) [39])"Incorrect SUBDIRS command. Directory: ",__lhs,
                       (char (*) [17])0x73cd0b);
            std::__cxx11::string::_M_assign(local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
            bVar2 = false;
          }
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmSubdirCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;
  cmMakefile& mf = status.GetMakefile();

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath = mf.GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" + i;
      mf.AddSubDirectory(srcPath, binPath, excludeFromAll, false, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      mf.AddSubDirectory(i, binPath, excludeFromAll, false, false);
    } else {
      status.SetError(cmStrCat("Incorrect SUBDIRS command. Directory: ", i,
                               " does not exist."));
      res = false;
    }
  }
  return res;
}